

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O1

Properties * __thiscall
QFontEngine::properties(Properties *__return_storage_ptr__,QFontEngine *this)

{
  QArrayData *pQVar1;
  char *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  longlong __old_val;
  long lVar8;
  undefined8 *puVar9;
  Properties *pPVar10;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  QArrayData *local_188;
  char *pcStack_180;
  qsizetype local_178;
  QArrayData *local_170;
  char *pcStack_168;
  qsizetype local_160;
  QString local_158;
  QByteArray local_140;
  QByteArray local_128;
  QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray> local_110;
  QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray> local_d8;
  char local_a0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>
  local_98;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar9 = &DAT_006b8368;
  pPVar10 = __return_storage_ptr__;
  for (lVar8 = 0xe; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pPVar10->postscriptName).d.d = (Data *)*puVar9;
    puVar9 = puVar9 + 1;
    pPVar10 = (Properties *)&(pPVar10->postscriptName).d.ptr;
  }
  __return_storage_ptr__->leading = 0;
  __return_storage_ptr__->italicAngle = 0;
  __return_storage_ptr__->capHeight = 0;
  __return_storage_ptr__->lineWidth = 0;
  __return_storage_ptr__->emSquare = 0;
  __return_storage_ptr__->ascent = 0;
  __return_storage_ptr__->descent = 0;
  __return_storage_ptr__->leading = 0;
  (__return_storage_ptr__->boundingBox).w = 0.0;
  (__return_storage_ptr__->boundingBox).h = 0.0;
  (__return_storage_ptr__->boundingBox).xp = 0.0;
  (__return_storage_ptr__->boundingBox).yp = 0.0;
  (__return_storage_ptr__->copyright).d.ptr = (char *)0x0;
  (__return_storage_ptr__->copyright).d.size = 0;
  (__return_storage_ptr__->postscriptName).d.size = 0;
  (__return_storage_ptr__->copyright).d.d = (Data *)0x0;
  (__return_storage_ptr__->postscriptName).d.d = (Data *)0x0;
  (__return_storage_ptr__->postscriptName).d.ptr = (char *)0x0;
  QString::toUtf8_helper(&local_158);
  convertToPostscriptFontFamilyName(&local_140,(QByteArray *)&local_158);
  qVar3 = local_140.d.size;
  pcVar2 = local_140.d.ptr;
  pDVar4 = local_140.d.d;
  local_140.d.d = (Data *)0x0;
  local_140.d.ptr = (char *)0x0;
  local_140.d.size = 0;
  QByteArray::number((uint)&local_170,*(uint *)&(this->fontDef).field_0x60 >> 0x1c & 3);
  local_d8.b.d.size = local_160;
  local_d8.b.d.ptr = pcStack_168;
  local_d8.b.d.d = (Data *)local_170;
  local_110.a.b = '-';
  local_170 = (QArrayData *)0x0;
  pcStack_168 = (char *)0x0;
  local_160 = 0;
  local_110.a.a.d.d = (Data *)0x0;
  local_d8.a.a.d.d = pDVar4;
  local_d8.a.a.d.ptr = pcVar2;
  local_110.a.a.d.ptr = (char *)0x0;
  local_110.a.a.d.size = 0;
  local_d8.a.a.d.size = qVar3;
  local_d8.a.b = '-';
  local_110.b.d.d = (Data *)0x0;
  local_110.b.d.ptr = (char *)0x0;
  local_110.b.d.size = 0;
  local_a0 = '-';
  QByteArray::number((uint)&local_188,
                     (uint)((ulong)*(undefined8 *)&(this->fontDef).field_0x60 >> 0x28) & 0x3ff);
  local_98.a.a.b.d.size = local_d8.b.d.size;
  local_98.a.a.b.d.ptr = local_d8.b.d.ptr;
  local_98.a.a.b.d.d = local_d8.b.d.d;
  local_98.a.a.a.a.d.size = local_d8.a.a.d.size;
  local_98.a.a.a.a.d.ptr = local_d8.a.a.d.ptr;
  local_98.a.a.a.a.d.d = local_d8.a.a.d.d;
  local_98.b.d.size = local_178;
  local_98.b.d.ptr = pcStack_180;
  local_98.b.d.d = (Data *)local_188;
  local_d8.a.a.d.d = (Data *)0x0;
  local_d8.a.a.d.ptr = (char *)0x0;
  local_d8.a.a.d.size = 0;
  local_98.a.a.a.b = local_d8.a.b;
  local_d8.b.d.d = (Data *)0x0;
  local_d8.b.d.ptr = (char *)0x0;
  local_d8.b.d.size = 0;
  local_98.a.b = local_a0;
  local_188 = (QArrayData *)0x0;
  pcStack_180 = (char *)0x0;
  local_178 = 0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>
  ::convertTo<QByteArray>(&local_128,&local_98);
  pQVar1 = &((__return_storage_ptr__->postscriptName).d.d)->super_QArrayData;
  pcVar2 = (__return_storage_ptr__->postscriptName).d.ptr;
  (__return_storage_ptr__->postscriptName).d.d = local_128.d.d;
  (__return_storage_ptr__->postscriptName).d.ptr = local_128.d.ptr;
  qVar3 = (__return_storage_ptr__->postscriptName).d.size;
  (__return_storage_ptr__->postscriptName).d.size = local_128.d.size;
  local_128.d.d = (Data *)pQVar1;
  local_128.d.ptr = pcVar2;
  local_128.d.size = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,1,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>
  ::~QStringBuilder(&local_98);
  if (local_188 != (QArrayData *)0x0) {
    LOCK();
    (local_188->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_188->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_188->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_188,1,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>::~QStringBuilder(&local_d8);
  QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>::~QStringBuilder(&local_110);
  if (local_170 != (QArrayData *)0x0) {
    LOCK();
    (local_170->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_170->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_170->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_170,1,0x10);
    }
  }
  if (&(local_140.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_140.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,1,0x10);
    }
  }
  iVar5 = (*this->_vptr_QFontEngine[0x1e])(this);
  (__return_storage_ptr__->ascent).val = iVar5;
  iVar6 = (*this->_vptr_QFontEngine[0x20])(this);
  (__return_storage_ptr__->descent).val = iVar6;
  iVar7 = (*this->_vptr_QFontEngine[0x21])(this);
  (__return_storage_ptr__->leading).val = iVar7;
  (__return_storage_ptr__->emSquare).val = iVar5;
  (*this->_vptr_QFontEngine[0x26])(this);
  (__return_storage_ptr__->boundingBox).xp = 0.0;
  (__return_storage_ptr__->boundingBox).yp = (double)iVar5 * -0.015625;
  (__return_storage_ptr__->boundingBox).w = (qreal)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  (__return_storage_ptr__->boundingBox).h = (double)(iVar6 + iVar5) * 0.015625;
  (__return_storage_ptr__->italicAngle).val = 0;
  (__return_storage_ptr__->capHeight).val = iVar5;
  iVar5 = (*this->_vptr_QFontEngine[0x24])(this);
  (__return_storage_ptr__->lineWidth).val = iVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QFontEngine::Properties QFontEngine::properties() const
{
    Properties p;
    p.postscriptName =
            QFontEngine::convertToPostscriptFontFamilyName(fontDef.families.first().toUtf8()) + '-'
            + QByteArray::number(fontDef.style) + '-' + QByteArray::number(fontDef.weight);
    p.ascent = ascent();
    p.descent = descent();
    p.leading = leading();
    p.emSquare = p.ascent;
    p.boundingBox = QRectF(0, -p.ascent.toReal(), maxCharWidth(), (p.ascent + p.descent).toReal());
    p.italicAngle = 0;
    p.capHeight = p.ascent;
    p.lineWidth = lineThickness();
    return p;
}